

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_ptr<char,std::back_insert_iterator<std::__cxx11::string>,unsigned_long>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,unsigned_long value,basic_format_specs<char> *specs)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  unsigned_long uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ulong uVar10;
  
  uVar9 = 2;
  uVar8 = value;
  do {
    uVar9 = uVar9 + 1;
    bVar4 = 0xf < uVar8;
    uVar8 = uVar8 >> 4;
  } while (bVar4);
  if (specs == (basic_format_specs<char> *)0x0) {
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize((ulong)out.container,(char)sVar2 + (char)uVar9);
    pcVar3 = ((out.container)->_M_dataplus)._M_p;
    pcVar1 = pcVar3 + sVar2;
    pcVar1[0] = '0';
    pcVar1[1] = 'x';
    pcVar6 = pcVar3 + uVar9 + sVar2;
    do {
      pcVar6 = pcVar6 + -1;
      *pcVar6 = "0123456789abcdef"[(uint)value & 0xf];
      bVar4 = 0xf < value;
      value = value >> 4;
    } while (bVar4);
  }
  else {
    uVar5 = (ulong)specs->width;
    if ((long)uVar5 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    uVar10 = 0;
    if (uVar9 <= uVar5) {
      uVar10 = uVar5 - uVar9;
    }
    uVar5 = uVar10 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize
              ((ulong)out.container,(specs->fill).size_ * (char)uVar10 + (char)sVar2 + (char)uVar9);
    pcVar6 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar5,&specs->fill);
    pcVar6[0] = '0';
    pcVar6[1] = 'x';
    pcVar7 = pcVar6 + uVar9;
    do {
      pcVar7 = pcVar7 + -1;
      *pcVar7 = "0123456789abcdef"[(uint)value & 0xf];
      bVar4 = 0xf < value;
      value = value >> 4;
    } while (bVar4);
    fill<char*,char>(pcVar6 + uVar9,uVar10 - uVar5,&specs->fill);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}